

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProfileMemory.cpp
# Opt level: O3

void MemoryProfiler::PrintPageMemoryData(PageMemoryData *pageMemoryData,char *title)

{
  if (pageMemoryData->allocSegmentCount != 0) {
    Output::Print(L"%-10S:%9d %10d | %4d %10d | %4d %10d | %10d | %10d | %10d | %10d\n",title,
                  pageMemoryData->currentCommittedPageCount << 0xc,
                  pageMemoryData->peakCommittedPageCount << 0xc,pageMemoryData->allocSegmentCount,
                  pageMemoryData->allocSegmentBytes,(int)pageMemoryData->releaseSegmentCount,
                  (int)pageMemoryData->releaseSegmentBytes,pageMemoryData->allocPageCount << 0xc,
                  pageMemoryData->releasePageCount << 0xc,pageMemoryData->decommitPageCount << 0xc,
                  pageMemoryData->recommitPageCount << 0xc);
  }
  return;
}

Assistant:

void
MemoryProfiler::PrintPageMemoryData(PageMemoryData const& pageMemoryData, char const * title)
{
    if (pageMemoryData.allocSegmentCount != 0)
    {
        Output::Print(_u("%-10S:%9d %10d | %4d %10d | %4d %10d | %10d | %10d | %10d | %10d\n"), title,
            pageMemoryData.currentCommittedPageCount * AutoSystemInfo::PageSize, pageMemoryData.peakCommittedPageCount * AutoSystemInfo::PageSize,
            pageMemoryData.allocSegmentCount, pageMemoryData.allocSegmentBytes,
            pageMemoryData.releaseSegmentCount, pageMemoryData.releaseSegmentBytes,
            pageMemoryData.allocPageCount * AutoSystemInfo::PageSize,
            pageMemoryData.releasePageCount * AutoSystemInfo::PageSize,
            pageMemoryData.decommitPageCount * AutoSystemInfo::PageSize,
            pageMemoryData.recommitPageCount * AutoSystemInfo::PageSize);
    }
}